

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,void *ptr)

{
  ImGuiID IVar1;
  uint *puVar2;
  long in_RDI;
  ImGuiContext *g;
  ImGuiID id;
  ImGuiID seed;
  void *in_stack_00000070;
  void *in_stack_00000078;
  ImGuiDataType in_stack_00000080;
  ImGuiID in_stack_00000084;
  undefined1 local_10 [16];
  
  puVar2 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)(in_RDI + 200));
  IVar1 = ImHashData(local_10,8,*puVar2);
  if (GImGui->DebugHookIdInfo == IVar1) {
    ImGui::DebugHookIdInfo(in_stack_00000084,in_stack_00000080,in_stack_00000078,in_stack_00000070);
  }
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_Pointer, ptr, NULL);
    return id;
}